

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::PReLU_x86_avx::forward_inplace(PReLU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  uint *puVar6;
  undefined4 *puVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  int iVar19;
  float *ptr;
  uint uVar20;
  ulong uVar21;
  undefined1 (*pauVar22) [32];
  int iVar23;
  uint uVar24;
  undefined1 (*pauVar25) [32];
  uint uVar26;
  undefined1 (*pauVar27) [16];
  ulong uVar28;
  int iVar29;
  long lVar30;
  uint uVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [28];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  
  auVar9 = _DAT_00515ca0;
  auVar8 = _DAT_00515c80;
  iVar19 = bottom_top_blob->elempack;
  iVar23 = bottom_top_blob->dims;
  iVar29 = bottom_top_blob->w;
  uVar26 = bottom_top_blob->h;
  auVar36 = in_ZMM5._0_16_;
  if (iVar23 == 3) {
    uVar20 = bottom_top_blob->c;
    if (0 < (int)uVar20) {
      uVar26 = iVar29 * iVar19 * uVar26;
      pp_Var4 = this->_vptr_PReLU_x86_avx;
      uVar28 = 0;
      auVar50 = ZEXT816(0);
      auVar34._8_8_ = 0x8000000000000000;
      auVar34._0_8_ = 0x8000000000000000;
      auVar36 = vpcmpeqd_avx(auVar36,auVar36);
      auVar39._8_4_ = 0xffff;
      auVar39._0_8_ = 0xffff0000ffff;
      auVar39._12_4_ = 0xffff;
      auVar39._16_4_ = 0xffff;
      auVar39._20_4_ = 0xffff;
      auVar39._24_4_ = 0xffff;
      auVar39._28_4_ = 0xffff;
      do {
        puVar7 = *(undefined4 **)(&this->field_0xd8 + (long)pp_Var4[-3]);
        if (*(int *)(&this->field_0xd0 + (long)pp_Var4[-3]) < 2) {
          uVar3 = *puVar7;
          auVar69._4_4_ = uVar3;
          auVar69._0_4_ = uVar3;
          auVar69._8_4_ = uVar3;
          auVar69._12_4_ = uVar3;
          auVar43 = auVar69;
LAB_003374de:
          auVar33 = auVar43;
          auVar46._16_16_ = auVar69;
          auVar46._0_16_ = auVar69;
          auVar44 = auVar46._0_28_;
        }
        else {
          uVar31 = puVar7[uVar28];
          auVar33 = ZEXT416(uVar31);
          auVar43 = ZEXT416(uVar31);
          if (iVar19 == 4) {
            auVar69 = *(undefined1 (*) [16])(puVar7 + uVar28 * 4);
            goto LAB_003374de;
          }
          auVar69 = vshufps_avx(ZEXT416(uVar31),ZEXT416(uVar31),0);
          if (iVar19 != 8) goto LAB_003374de;
          auVar44 = SUB3228(*(undefined1 (*) [32])(puVar7 + uVar28 * 8),0);
        }
        pauVar22 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * uVar28 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar31 = 0;
        if (7 < (int)uVar26) {
          iVar23 = 7;
          do {
            auVar46 = vmaxps_avx(*pauVar22,ZEXT1632(auVar50));
            auVar62 = vminps_avx(*pauVar22,ZEXT1632(auVar50));
            auVar52._0_4_ = auVar62._0_4_ * auVar44._0_4_ + auVar46._0_4_;
            auVar52._4_4_ = auVar62._4_4_ * auVar44._4_4_ + auVar46._4_4_;
            auVar52._8_4_ = auVar62._8_4_ * auVar44._8_4_ + auVar46._8_4_;
            auVar52._12_4_ = auVar62._12_4_ * auVar44._12_4_ + auVar46._12_4_;
            auVar52._16_4_ = auVar62._16_4_ * auVar44._16_4_ + auVar46._16_4_;
            auVar52._20_4_ = auVar62._20_4_ * auVar44._20_4_ + auVar46._20_4_;
            auVar52._24_4_ = auVar62._24_4_ * auVar44._24_4_ + auVar46._24_4_;
            auVar52._28_4_ = auVar62._28_4_ + auVar46._28_4_;
            *pauVar22 = auVar52;
            pauVar22 = pauVar22 + 1;
            iVar23 = iVar23 + 8;
            uVar31 = uVar26 & 0xfffffff8;
          } while (iVar23 < (int)uVar26);
        }
        uVar24 = uVar31 | 3;
        while ((int)uVar24 < (int)uVar26) {
          auVar43 = vmaxps_avx(*(undefined1 (*) [16])*pauVar22,ZEXT816(0));
          auVar41 = vminps_avx(*(undefined1 (*) [16])*pauVar22,ZEXT816(0));
          *(float *)*pauVar22 = auVar41._0_4_ * auVar69._0_4_ + auVar43._0_4_;
          *(float *)(*pauVar22 + 4) = auVar41._4_4_ * auVar69._4_4_ + auVar43._4_4_;
          *(float *)(*pauVar22 + 8) = auVar41._8_4_ * auVar69._8_4_ + auVar43._8_4_;
          *(float *)(*pauVar22 + 0xc) = auVar41._12_4_ * auVar69._12_4_ + auVar43._12_4_;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          uVar24 = uVar31 + 7;
          uVar31 = uVar31 + 4;
        }
        if ((int)uVar31 < (int)uVar26) {
          uVar21 = CONCAT44(0,~uVar31 + uVar26);
          auVar43._8_8_ = 0;
          auVar43._0_8_ = uVar21;
          auVar41 = vpshufd_avx(auVar43,0x44);
          auVar33 = vshufps_avx(auVar33,auVar33,0);
          auVar69 = vorps_avx(auVar41,auVar34);
          auVar43 = vorps_avx(auVar41,auVar34);
          uVar32 = 0;
          do {
            auVar57._8_8_ = 0;
            auVar57._0_8_ = uVar32;
            auVar57 = vpshufd_avx(auVar57,0x44);
            auVar62._16_16_ = auVar57;
            auVar62._0_16_ = auVar57;
            auVar46 = vorps_avx(auVar62,auVar8);
            auVar62 = vorps_avx(auVar62,auVar9);
            auVar57 = vorps_avx(auVar41,auVar34);
            auVar72._0_8_ = auVar62._16_8_ ^ 0x8000000000000000;
            auVar72._8_4_ = auVar62._24_4_;
            auVar72._12_4_ = auVar62._28_4_ ^ 0x80000000;
            auVar72 = vpcmpgtq_avx(auVar72,auVar57);
            auVar58._0_8_ = auVar62._0_8_ ^ 0x8000000000000000;
            auVar58._8_4_ = auVar62._8_4_;
            auVar58._12_4_ = auVar62._12_4_ ^ 0x80000000;
            auVar58 = vpcmpgtq_avx(auVar58,auVar69);
            auVar72 = vpackssdw_avx(auVar58,auVar72);
            auVar75._0_8_ = auVar46._16_8_ ^ 0x8000000000000000;
            auVar75._8_4_ = auVar46._24_4_;
            auVar75._12_4_ = auVar46._28_4_ ^ 0x80000000;
            auVar57 = vpcmpgtq_avx(auVar75,auVar57);
            auVar66._0_8_ = auVar46._0_8_ ^ 0x8000000000000000;
            auVar66._8_4_ = auVar46._8_4_;
            auVar66._12_4_ = auVar46._12_4_ ^ 0x80000000;
            auVar58 = vpcmpgtq_avx(auVar66,auVar43);
            auVar57 = vpackssdw_avx(auVar58,auVar57);
            auVar57 = vpackssdw_avx(auVar57 ^ auVar36,auVar72 ^ auVar36);
            auVar72 = vpmovsxwd_avx(auVar57);
            auVar58 = vpunpckhwd_avx(auVar57,auVar57);
            auVar71._16_16_ = auVar58;
            auVar71._0_16_ = auVar72;
            auVar62 = vmaskmovps_avx(auVar71,*(undefined1 (*) [32])(*pauVar22 + uVar32 * 4));
            auVar46 = vcmpps_avx(auVar62,ZEXT1632(auVar50),1);
            auVar46 = vandps_avx(auVar46,auVar39);
            auVar72 = vpackusdw_avx(auVar46._0_16_,auVar46._16_16_);
            auVar57 = vpand_avx(auVar57,auVar72);
            auVar72 = vpmovzxwd_avx(auVar57);
            auVar72 = vpslld_avx(auVar72,0x1f);
            auVar57 = vpunpckhwd_avx(auVar57,auVar57);
            auVar57 = vpslld_avx(auVar57,0x1f);
            auVar63._16_16_ = auVar57;
            auVar63._0_16_ = auVar72;
            auVar11._4_4_ = auVar62._4_4_ * auVar33._4_4_;
            auVar11._0_4_ = auVar62._0_4_ * auVar33._0_4_;
            auVar11._8_4_ = auVar62._8_4_ * auVar33._8_4_;
            auVar11._12_4_ = auVar62._12_4_ * auVar33._12_4_;
            auVar11._16_4_ = auVar62._16_4_ * auVar33._0_4_;
            auVar11._20_4_ = auVar62._20_4_ * auVar33._4_4_;
            auVar11._24_4_ = auVar62._24_4_ * auVar33._8_4_;
            auVar11._28_4_ = auVar62._28_4_;
            auVar46 = vmaskmovps_avx(auVar63,auVar11);
            *(undefined1 (*) [32])(*pauVar22 + uVar32 * 4) = auVar46;
            uVar32 = uVar32 + 8;
          } while ((uVar21 + 8 & 0x1fffffff8) != uVar32);
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 != uVar20);
    }
  }
  else if (iVar23 == 2) {
    if (0 < (int)uVar26) {
      uVar20 = iVar29 * iVar19;
      pp_Var4 = this->_vptr_PReLU_x86_avx;
      uVar28 = 0;
      auVar50 = ZEXT816(0);
      auVar33._8_8_ = 0x8000000000000000;
      auVar33._0_8_ = 0x8000000000000000;
      auVar36 = vpcmpeqd_avx(auVar36,auVar36);
      auVar38._8_4_ = 0xffff;
      auVar38._0_8_ = 0xffff0000ffff;
      auVar38._12_4_ = 0xffff;
      auVar38._16_4_ = 0xffff;
      auVar38._20_4_ = 0xffff;
      auVar38._24_4_ = 0xffff;
      auVar38._28_4_ = 0xffff;
      do {
        puVar7 = *(undefined4 **)(&this->field_0xd8 + (long)pp_Var4[-3]);
        if (*(int *)(&this->field_0xd0 + (long)pp_Var4[-3]) < 2) {
          uVar3 = *puVar7;
          auVar41._4_4_ = uVar3;
          auVar41._0_4_ = uVar3;
          auVar41._8_4_ = uVar3;
          auVar41._12_4_ = uVar3;
          auVar34 = auVar41;
LAB_0033728d:
          auVar69 = auVar34;
          auVar45._16_16_ = auVar41;
          auVar45._0_16_ = auVar41;
          auVar44 = auVar45._0_28_;
        }
        else {
          uVar31 = puVar7[uVar28];
          auVar69 = ZEXT416(uVar31);
          auVar34 = ZEXT416(uVar31);
          if (iVar19 == 4) {
            auVar41 = *(undefined1 (*) [16])(puVar7 + uVar28 * 4);
            goto LAB_0033728d;
          }
          auVar41 = vshufps_avx(ZEXT416(uVar31),ZEXT416(uVar31),0);
          if (iVar19 != 8) goto LAB_0033728d;
          auVar44 = SUB3228(*(undefined1 (*) [32])(puVar7 + uVar28 * 8),0);
        }
        pauVar22 = (undefined1 (*) [32])
                   ((long)bottom_top_blob->w * uVar28 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar31 = 0;
        if (7 < (int)uVar20) {
          iVar23 = 7;
          do {
            auVar39 = vmaxps_avx(*pauVar22,ZEXT1632(auVar50));
            auVar46 = vminps_avx(*pauVar22,ZEXT1632(auVar50));
            auVar51._0_4_ = auVar46._0_4_ * auVar44._0_4_ + auVar39._0_4_;
            auVar51._4_4_ = auVar46._4_4_ * auVar44._4_4_ + auVar39._4_4_;
            auVar51._8_4_ = auVar46._8_4_ * auVar44._8_4_ + auVar39._8_4_;
            auVar51._12_4_ = auVar46._12_4_ * auVar44._12_4_ + auVar39._12_4_;
            auVar51._16_4_ = auVar46._16_4_ * auVar44._16_4_ + auVar39._16_4_;
            auVar51._20_4_ = auVar46._20_4_ * auVar44._20_4_ + auVar39._20_4_;
            auVar51._24_4_ = auVar46._24_4_ * auVar44._24_4_ + auVar39._24_4_;
            auVar51._28_4_ = auVar46._28_4_ + auVar39._28_4_;
            *pauVar22 = auVar51;
            pauVar22 = pauVar22 + 1;
            iVar23 = iVar23 + 8;
            uVar31 = uVar20 & 0xfffffff8;
          } while (iVar23 < (int)uVar20);
        }
        uVar24 = uVar31 | 3;
        while ((int)uVar24 < (int)uVar20) {
          auVar34 = vmaxps_avx(*(undefined1 (*) [16])*pauVar22,ZEXT816(0));
          auVar43 = vminps_avx(*(undefined1 (*) [16])*pauVar22,ZEXT816(0));
          *(float *)*pauVar22 = auVar43._0_4_ * auVar41._0_4_ + auVar34._0_4_;
          *(float *)(*pauVar22 + 4) = auVar43._4_4_ * auVar41._4_4_ + auVar34._4_4_;
          *(float *)(*pauVar22 + 8) = auVar43._8_4_ * auVar41._8_4_ + auVar34._8_4_;
          *(float *)(*pauVar22 + 0xc) = auVar43._12_4_ * auVar41._12_4_ + auVar34._12_4_;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          uVar24 = uVar31 + 7;
          uVar31 = uVar31 + 4;
        }
        if ((int)uVar31 < (int)uVar20) {
          uVar21 = CONCAT44(0,~uVar31 + uVar20);
          auVar42._8_8_ = 0;
          auVar42._0_8_ = uVar21;
          auVar43 = vpshufd_avx(auVar42,0x44);
          auVar41 = vshufps_avx(auVar69,auVar69,0);
          auVar34 = vorps_avx(auVar43,auVar33);
          auVar69 = vorps_avx(auVar43,auVar33);
          uVar32 = 0;
          do {
            auVar55._8_8_ = 0;
            auVar55._0_8_ = uVar32;
            auVar57 = vpshufd_avx(auVar55,0x44);
            auVar60._16_16_ = auVar57;
            auVar60._0_16_ = auVar57;
            auVar39 = vorps_avx(auVar60,auVar8);
            auVar46 = vorps_avx(auVar60,auVar9);
            auVar57 = vorps_avx(auVar43,auVar33);
            auVar73._0_8_ = auVar46._16_8_ ^ 0x8000000000000000;
            auVar73._8_4_ = auVar46._24_4_;
            auVar73._12_4_ = auVar46._28_4_ ^ 0x80000000;
            auVar72 = vpcmpgtq_avx(auVar73,auVar57);
            auVar56._0_8_ = auVar46._0_8_ ^ 0x8000000000000000;
            auVar56._8_4_ = auVar46._8_4_;
            auVar56._12_4_ = auVar46._12_4_ ^ 0x80000000;
            auVar58 = vpcmpgtq_avx(auVar56,auVar34);
            auVar72 = vpackssdw_avx(auVar58,auVar72);
            auVar74._0_8_ = auVar39._16_8_ ^ 0x8000000000000000;
            auVar74._8_4_ = auVar39._24_4_;
            auVar74._12_4_ = auVar39._28_4_ ^ 0x80000000;
            auVar57 = vpcmpgtq_avx(auVar74,auVar57);
            auVar65._0_8_ = auVar39._0_8_ ^ 0x8000000000000000;
            auVar65._8_4_ = auVar39._8_4_;
            auVar65._12_4_ = auVar39._12_4_ ^ 0x80000000;
            auVar58 = vpcmpgtq_avx(auVar65,auVar69);
            auVar57 = vpackssdw_avx(auVar58,auVar57);
            auVar57 = vpackssdw_avx(auVar57 ^ auVar36,auVar72 ^ auVar36);
            auVar72 = vpmovsxwd_avx(auVar57);
            auVar58 = vpunpckhwd_avx(auVar57,auVar57);
            auVar70._16_16_ = auVar58;
            auVar70._0_16_ = auVar72;
            auVar46 = vmaskmovps_avx(auVar70,*(undefined1 (*) [32])(*pauVar22 + uVar32 * 4));
            auVar39 = vcmpps_avx(auVar46,ZEXT1632(auVar50),1);
            auVar39 = vandps_avx(auVar39,auVar38);
            auVar72 = vpackusdw_avx(auVar39._0_16_,auVar39._16_16_);
            auVar57 = vpand_avx(auVar57,auVar72);
            auVar72 = vpmovzxwd_avx(auVar57);
            auVar72 = vpslld_avx(auVar72,0x1f);
            auVar57 = vpunpckhwd_avx(auVar57,auVar57);
            auVar57 = vpslld_avx(auVar57,0x1f);
            auVar61._16_16_ = auVar57;
            auVar61._0_16_ = auVar72;
            auVar10._4_4_ = auVar46._4_4_ * auVar41._4_4_;
            auVar10._0_4_ = auVar46._0_4_ * auVar41._0_4_;
            auVar10._8_4_ = auVar46._8_4_ * auVar41._8_4_;
            auVar10._12_4_ = auVar46._12_4_ * auVar41._12_4_;
            auVar10._16_4_ = auVar46._16_4_ * auVar41._0_4_;
            auVar10._20_4_ = auVar46._20_4_ * auVar41._4_4_;
            auVar10._24_4_ = auVar46._24_4_ * auVar41._8_4_;
            auVar10._28_4_ = auVar46._28_4_;
            auVar39 = vmaskmovps_avx(auVar61,auVar10);
            *(undefined1 (*) [32])(*pauVar22 + uVar32 * 4) = auVar39;
            uVar32 = uVar32 + 8;
          } while ((uVar21 + 8 & 0x1fffffff8) != uVar32);
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 != uVar26);
    }
  }
  else if (iVar23 == 1) {
    iVar19 = iVar19 * iVar29;
    pp_Var4 = this->_vptr_PReLU_x86_avx;
    p_Var5 = pp_Var4[-3];
    pauVar22 = (undefined1 (*) [32])bottom_top_blob->data;
    puVar6 = *(uint **)(&this->field_0xd8 + (long)p_Var5);
    if (*(int *)(&this->field_0xd0 + (long)p_Var5) < 2) {
      uVar26 = *puVar6;
      iVar23 = iVar19 + 7;
      if (-1 < iVar19) {
        iVar23 = iVar19;
      }
      uVar20 = iVar23 >> 3;
      if (7 < iVar19) {
        auVar36 = vshufps_avx(ZEXT416(uVar26),ZEXT416(uVar26),0);
        uVar28 = (ulong)uVar20;
        pauVar25 = pauVar22;
        do {
          auVar8 = vmaxps_avx(*pauVar25,ZEXT1632(ZEXT816(0) << 0x40));
          auVar9 = vminps_avx(*pauVar25,ZEXT1632(ZEXT816(0) << 0x40));
          *(float *)*pauVar25 = auVar9._0_4_ * auVar36._0_4_ + auVar8._0_4_;
          *(float *)(*pauVar25 + 4) = auVar9._4_4_ * auVar36._4_4_ + auVar8._4_4_;
          *(float *)(*pauVar25 + 8) = auVar9._8_4_ * auVar36._8_4_ + auVar8._8_4_;
          *(float *)(*pauVar25 + 0xc) = auVar9._12_4_ * auVar36._12_4_ + auVar8._12_4_;
          *(float *)(*pauVar25 + 0x10) = auVar9._16_4_ * auVar36._0_4_ + auVar8._16_4_;
          *(float *)(*pauVar25 + 0x14) = auVar9._20_4_ * auVar36._4_4_ + auVar8._20_4_;
          *(float *)(*pauVar25 + 0x18) = auVar9._24_4_ * auVar36._8_4_ + auVar8._24_4_;
          *(float *)(*pauVar25 + 0x1c) = auVar9._28_4_ + auVar8._28_4_;
          pauVar25 = pauVar25 + 1;
          uVar28 = uVar28 - 1;
        } while (uVar28 != 0);
      }
      iVar29 = iVar19 + uVar20 * -8;
      iVar23 = iVar29 + 3;
      if (-1 < iVar29) {
        iVar23 = iVar29;
      }
      auVar36 = ZEXT416(uVar26);
      if (3 < iVar29) {
        auVar50 = vshufps_avx(auVar36,auVar36,0);
        uVar28 = (ulong)(uint)(iVar23 >> 2);
        pauVar27 = (undefined1 (*) [16])(*pauVar22 + (long)(int)(uVar20 * 8) * 4);
        do {
          auVar34 = vmaxps_avx(*pauVar27,ZEXT816(0) << 0x40);
          auVar69 = vminps_avx(*pauVar27,ZEXT816(0) << 0x40);
          *(float *)*pauVar27 = auVar69._0_4_ * auVar50._0_4_ + auVar34._0_4_;
          *(float *)(*pauVar27 + 4) = auVar69._4_4_ * auVar50._4_4_ + auVar34._4_4_;
          *(float *)(*pauVar27 + 8) = auVar69._8_4_ * auVar50._8_4_ + auVar34._8_4_;
          *(float *)(*pauVar27 + 0xc) = auVar69._12_4_ * auVar50._12_4_ + auVar34._12_4_;
          pauVar27 = pauVar27 + 1;
          uVar28 = uVar28 - 1;
        } while (uVar28 != 0);
      }
      auVar9 = _DAT_00515ca0;
      auVar8 = _DAT_00515c80;
      iVar23 = uVar20 * 8 + (iVar23 >> 2) * 4;
      if (iVar23 < iVar19) {
        lVar30 = (long)iVar23;
        auVar50._8_8_ = 0;
        auVar50._0_8_ = (iVar19 - lVar30) - 1;
        auVar50 = vpshufd_avx(auVar50,0x44);
        auVar34 = vshufps_avx(auVar36,auVar36,0);
        uVar21 = 0;
        uVar28 = auVar50._0_8_;
        auVar35._0_8_ = uVar28 ^ 0x8000000000000000;
        auVar35._8_4_ = auVar50._8_4_;
        uVar26 = auVar50._12_4_;
        auVar35._12_4_ = uVar26 ^ 0x80000000;
        auVar37._0_8_ = uVar28 ^ 0x8000000000000000;
        auVar37._8_4_ = auVar35._8_4_;
        auVar37._12_4_ = uVar26 ^ 0x80000000;
        auVar36 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
        auVar40._0_8_ = uVar28 ^ 0x8000000000000000;
        auVar40._8_4_ = auVar35._8_4_;
        auVar40._12_4_ = uVar26 ^ 0x80000000;
        auVar47._8_4_ = 0xffff;
        auVar47._0_8_ = 0xffff0000ffff;
        auVar47._12_4_ = 0xffff;
        auVar47._16_4_ = 0xffff;
        auVar47._20_4_ = 0xffff;
        auVar47._24_4_ = 0xffff;
        auVar47._28_4_ = 0xffff;
        do {
          auVar48._8_8_ = 0;
          auVar48._0_8_ = uVar21;
          auVar50 = vpshufd_avx(auVar48,0x44);
          auVar53._16_16_ = auVar50;
          auVar53._0_16_ = auVar50;
          auVar39 = vorps_avx(auVar53,auVar8);
          auVar46 = vorps_avx(auVar53,auVar9);
          auVar67._0_8_ = auVar46._16_8_ ^ 0x8000000000000000;
          auVar67._8_4_ = auVar46._24_4_;
          auVar67._12_4_ = auVar46._28_4_ ^ 0x80000000;
          auVar50 = vpcmpgtq_avx(auVar67,auVar35);
          auVar49._0_8_ = auVar46._0_8_ ^ 0x8000000000000000;
          auVar49._8_4_ = auVar46._8_4_;
          auVar49._12_4_ = auVar46._12_4_ ^ 0x80000000;
          auVar69 = vpcmpgtq_avx(auVar49,auVar37);
          auVar50 = vpackssdw_avx(auVar69,auVar50);
          auVar68._0_8_ = auVar39._16_8_ ^ 0x8000000000000000;
          auVar68._8_4_ = auVar39._24_4_;
          auVar68._12_4_ = auVar39._28_4_ ^ 0x80000000;
          auVar69 = vpcmpgtq_avx(auVar68,auVar35);
          auVar59._0_8_ = auVar39._0_8_ ^ 0x8000000000000000;
          auVar59._8_4_ = auVar39._8_4_;
          auVar59._12_4_ = auVar39._12_4_ ^ 0x80000000;
          auVar43 = vpcmpgtq_avx(auVar59,auVar40);
          auVar69 = vpackssdw_avx(auVar43,auVar69);
          auVar50 = vpackssdw_avx(auVar69 ^ auVar36,auVar50 ^ auVar36);
          auVar69 = vpmovsxwd_avx(auVar50);
          auVar43 = vpunpckhwd_avx(auVar50,auVar50);
          auVar64._16_16_ = auVar43;
          auVar64._0_16_ = auVar69;
          auVar46 = vmaskmovps_avx(auVar64,*(undefined1 (*) [32])
                                            (*pauVar22 + uVar21 * 4 + lVar30 * 4));
          auVar39 = vcmpps_avx(auVar46,ZEXT1632(ZEXT816(0) << 0x40),1);
          auVar39 = vandps_avx(auVar39,auVar47);
          auVar69 = vpackusdw_avx(auVar39._0_16_,auVar39._16_16_);
          auVar50 = vpand_avx(auVar50,auVar69);
          auVar69 = vpmovzxwd_avx(auVar50);
          auVar69 = vpslld_avx(auVar69,0x1f);
          auVar50 = vpunpckhwd_avx(auVar50,auVar50);
          auVar50 = vpslld_avx(auVar50,0x1f);
          auVar54._16_16_ = auVar50;
          auVar54._0_16_ = auVar69;
          auVar12._4_4_ = auVar46._4_4_ * auVar34._4_4_;
          auVar12._0_4_ = auVar46._0_4_ * auVar34._0_4_;
          auVar12._8_4_ = auVar46._8_4_ * auVar34._8_4_;
          auVar12._12_4_ = auVar46._12_4_ * auVar34._12_4_;
          auVar12._16_4_ = auVar46._16_4_ * auVar34._0_4_;
          auVar12._20_4_ = auVar46._20_4_ * auVar34._4_4_;
          auVar12._24_4_ = auVar46._24_4_ * auVar34._8_4_;
          auVar12._28_4_ = auVar46._28_4_;
          auVar39 = vmaskmovps_avx(auVar54,auVar12);
          *(undefined1 (*) [32])(*pauVar22 + uVar21 * 4 + lVar30 * 4) = auVar39;
          uVar21 = uVar21 + 8;
        } while (((iVar19 - lVar30) + 7U & 0xfffffffffffffff8) != uVar21);
      }
    }
    else {
      iVar23 = iVar19 + 7;
      if (-1 < iVar19) {
        iVar23 = iVar19;
      }
      uVar26 = iVar23 >> 3;
      if (7 < iVar19) {
        uVar28 = (ulong)uVar26;
        lVar30 = 0;
        do {
          auVar8 = vmaxps_avx(*(undefined1 (*) [32])(*pauVar22 + lVar30),ZEXT1632(ZEXT816(0)));
          auVar9 = vminps_avx(*(undefined1 (*) [32])(*pauVar22 + lVar30),ZEXT1632(ZEXT816(0)));
          pfVar1 = (float *)((long)puVar6 + lVar30);
          fVar13 = pfVar1[1];
          fVar14 = pfVar1[2];
          fVar15 = pfVar1[3];
          fVar16 = pfVar1[4];
          fVar17 = pfVar1[5];
          fVar18 = pfVar1[6];
          pfVar2 = (float *)(*pauVar22 + lVar30);
          *pfVar2 = auVar9._0_4_ * *pfVar1 + auVar8._0_4_;
          pfVar2[1] = auVar9._4_4_ * fVar13 + auVar8._4_4_;
          pfVar2[2] = auVar9._8_4_ * fVar14 + auVar8._8_4_;
          pfVar2[3] = auVar9._12_4_ * fVar15 + auVar8._12_4_;
          pfVar2[4] = auVar9._16_4_ * fVar16 + auVar8._16_4_;
          pfVar2[5] = auVar9._20_4_ * fVar17 + auVar8._20_4_;
          pfVar2[6] = auVar9._24_4_ * fVar18 + auVar8._24_4_;
          pfVar2[7] = auVar9._28_4_ + auVar8._28_4_;
          lVar30 = lVar30 + 0x20;
          uVar28 = uVar28 - 1;
        } while (uVar28 != 0);
      }
      iVar29 = iVar19 + uVar26 * -8;
      iVar23 = iVar29 + 3;
      if (-1 < iVar29) {
        iVar23 = iVar29;
      }
      if (3 < iVar29) {
        uVar28 = (ulong)(uint)(iVar23 >> 2);
        lVar30 = (long)(int)(uVar26 * 8) << 2;
        do {
          auVar36 = vmaxps_avx(*(undefined1 (*) [16])(*pauVar22 + lVar30),ZEXT816(0) << 0x40);
          auVar50 = vminps_avx(*(undefined1 (*) [16])(*pauVar22 + lVar30),ZEXT816(0) << 0x40);
          pfVar1 = (float *)((long)puVar6 + lVar30);
          fVar13 = pfVar1[1];
          fVar14 = pfVar1[2];
          fVar15 = pfVar1[3];
          pfVar2 = (float *)(*pauVar22 + lVar30);
          *pfVar2 = auVar50._0_4_ * *pfVar1 + auVar36._0_4_;
          pfVar2[1] = auVar50._4_4_ * fVar13 + auVar36._4_4_;
          pfVar2[2] = auVar50._8_4_ * fVar14 + auVar36._8_4_;
          pfVar2[3] = auVar50._12_4_ * fVar15 + auVar36._12_4_;
          lVar30 = lVar30 + 0x10;
          uVar28 = uVar28 - 1;
        } while (uVar28 != 0);
      }
      iVar23 = uVar26 * 8 + (iVar23 >> 2) * 4;
      if (iVar23 < iVar19) {
        lVar30 = (long)iVar23;
        do {
          if (*(float *)(*pauVar22 + lVar30 * 4) < 0.0) {
            *(float *)(*pauVar22 + lVar30 * 4) =
                 *(float *)(*pauVar22 + lVar30 * 4) *
                 *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var4[-3]) + lVar30 * 4);
          }
          lVar30 = lVar30 + 1;
        } while (lVar30 < iVar19);
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_load_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}